

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O2

void __thiscall OpenMD::LJ::LJ(LJ *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_21;
  
  (this->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__LJ_002c76a0;
  this->initialized_ = false;
  p_Var1 = &(this->LJtypes)._M_t._M_impl.super__Rb_tree_header;
  (this->LJtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LJtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LJtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LJtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->forceField_ = (ForceField *)0x0;
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LJtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name_,"LJ",&local_21);
  return;
}

Assistant:

LJ::LJ() : initialized_(false), forceField_(NULL), name_("LJ") {}